

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGen::AppendFilenameSuffix_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename,string_view suffix)

{
  char *pcVar1;
  size_type sVar2;
  cmQtAutoGen *pcVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  char *local_28;
  size_t local_20;
  long local_18;
  char *local_10;
  
  local_20 = suffix._M_len;
  local_28 = filename._M_str;
  local_38._M_str = (char *)filename._M_len;
  pcVar3 = this;
  if (this == (cmQtAutoGen *)0x0) {
LAB_00483974:
    local_38._M_len = 0xffffffffffffffff;
  }
  else {
    do {
      local_38._M_len = (size_t)(pcVar3 + -1);
      if (pcVar3 == (cmQtAutoGen *)0x0) goto LAB_00483974;
      pcVar1 = local_38._M_str + -1 + (long)pcVar3;
      pcVar3 = (cmQtAutoGen *)local_38._M_len;
    } while (*pcVar1 != '.');
  }
  if ((cmQtAutoGen *)local_38._M_len == (cmQtAutoGen *)0xffffffffffffffff) {
    sVar2 = 2;
    local_38._M_len = (size_t)this;
  }
  else {
    local_18 = (long)this - local_38._M_len;
    if (this < local_38._M_len) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 local_38._M_len,this);
    }
    local_10 = local_38._M_str + local_38._M_len;
    sVar2 = 3;
  }
  views._M_len = sVar2;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::AppendFilenameSuffix(cm::string_view filename,
                                              cm::string_view suffix)
{
  auto dotPos = filename.rfind('.');
  if (dotPos == cm::string_view::npos) {
    return cmStrCat(filename, suffix);
  }
  return cmStrCat(filename.substr(0, dotPos), suffix,
                  filename.substr(dotPos, filename.size() - dotPos));
}